

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O2

int input_nybble(uchar *infile)

{
  if (bits_to_go < 4) {
    buffer2 = buffer2 << 8 | (uint)infile[nextchar];
    nextchar = nextchar + 1;
    bits_to_go = bits_to_go + 8;
  }
  bits_to_go = bits_to_go + -4;
  return buffer2 >> ((byte)bits_to_go & 0x1f) & 0xf;
}

Assistant:

static int input_nybble(unsigned char *infile)
{
	if (bits_to_go < 4) {
		/*
		 * need another byte's worth of bits
		 */

		buffer2 = (buffer2<<8) | (int) infile[nextchar];
		nextchar++;
		bits_to_go += 8;
	}
	/*
	 * now pick off the first 4 bits
	 */
	bits_to_go -= 4;

	return( (buffer2>>bits_to_go) & 15 ); 
}